

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool __thiscall
QApplicationPrivate::notify_helper(QApplicationPrivate *this,QObject *receiver,QEvent *e)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  Type pQVar4;
  Type pQVar5;
  Type pQVar6;
  ulong uVar7;
  QWidget *pQVar8;
  QWidget *pQVar9;
  QWidgetPrivate *pQVar10;
  QLayout *in_RDX;
  QEvent *in_RSI;
  QObject *in_RDI;
  bool in_stack_00000013;
  WidgetAttribute in_stack_00000014;
  QLayout *layout;
  QWidget *widget;
  QThreadData *threadData;
  bool filtered;
  bool consumed;
  QWidget *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 uVar11;
  undefined1 uVar12;
  bool local_1;
  
  uVar12 = 0;
  uVar11 = 0;
  QObject::d_func((QObject *)0x2cf715);
  pQVar4 = QBasicAtomicPointer<QThreadData>::loadRelaxed
                     ((QBasicAtomicPointer<QThreadData> *)0x2cf721);
  if (((byte)pQVar4[0x8f] & 1) != 0) {
    pQVar5 = QBasicAtomicPointer<QThread>::loadAcquire((QBasicAtomicPointer<QThread> *)0x2cf742);
    pQVar6 = (Type)QCoreApplicationPrivate::mainThread();
    if ((pQVar5 == pQVar6) &&
       (uVar7 = QCoreApplicationPrivate::sendThroughApplicationEventFilters(in_RDI,in_RSI),
       (uVar7 & 1) != 0)) {
      return true;
    }
  }
  bVar1 = QObject::isWidgetType((QObject *)0x2cf791);
  if (!bVar1) goto LAB_002cf85f;
  TVar3 = QEvent::type((QEvent *)in_RDX);
  if ((TVar3 == Enter) || (TVar3 = QEvent::type((QEvent *)in_RDX), TVar3 == DragEnter)) {
    pQVar8 = QApplication::activePopupWidget();
    if (pQVar8 != (QWidget *)0x0) {
      pQVar8 = QApplication::activePopupWidget();
      pQVar9 = QWidget::window(in_stack_ffffffffffffffc0);
      if (pQVar8 != pQVar9) goto LAB_002cf7ff;
    }
    QWidget::setAttribute((QWidget *)layout,in_stack_00000014,in_stack_00000013);
  }
  else {
LAB_002cf7ff:
    TVar3 = QEvent::type((QEvent *)in_RDX);
    if ((TVar3 == Leave) || (TVar3 = QEvent::type((QEvent *)in_RDX), TVar3 == DragLeave)) {
      QWidget::setAttribute((QWidget *)layout,in_stack_00000014,in_stack_00000013);
    }
  }
  pQVar10 = QWidget::d_func((QWidget *)0x2cf83a);
  if (pQVar10->layout != (QLayout *)0x0) {
    QLayout::widgetEvent
              (in_RDX,(QEvent *)CONCAT17(uVar12,CONCAT16(uVar11,in_stack_ffffffffffffffd8)));
  }
LAB_002cf85f:
  uVar7 = QCoreApplicationPrivate::sendThroughObjectEventFilters((QObject *)in_RSI,(QEvent *)in_RDX)
  ;
  if ((uVar7 & 1) == 0) {
    bVar2 = (**(code **)(*(long *)in_RSI + 0x28))();
    bVar2 = bVar2 & 1;
    QCoreApplicationPrivate::setEventSpontaneous((QEvent *)in_RDX,false);
    local_1 = (bool)(bVar2 & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QApplicationPrivate::notify_helper(QObject *receiver, QEvent * e)
{
    // These tracepoints (and the whole function, actually) are very similar
    // to the ones in QCoreApplicationPrivate::notify_helper; the reason for their
    // duplication is because tracepoint symbols are not exported by QtCore.
    // If you adjust the tracepoints here, consider adjusting QCoreApplicationPrivate too.
    Q_TRACE(QApplication_notify_entry, receiver, e, e->type());
    bool consumed = false;
    bool filtered = false;
    Q_TRACE_EXIT(QApplication_notify_exit, consumed, filtered);

    // send to all application event filters
    QThreadData *threadData = receiver->d_func()->threadData.loadRelaxed();
    if (threadData->requiresCoreApplication
        && threadData->thread.loadAcquire() == mainThread()
        && sendThroughApplicationEventFilters(receiver, e)) {
        filtered = true;
        return filtered;
    }

    if (receiver->isWidgetType()) {
        QWidget *widget = static_cast<QWidget *>(receiver);

#if !defined(QT_NO_CURSOR)
        // toggle HasMouse widget state on enter and leave
        if ((e->type() == QEvent::Enter || e->type() == QEvent::DragEnter) &&
            (!QApplication::activePopupWidget() || QApplication::activePopupWidget() == widget->window()))
            widget->setAttribute(Qt::WA_UnderMouse, true);
        else if (e->type() == QEvent::Leave || e->type() == QEvent::DragLeave)
            widget->setAttribute(Qt::WA_UnderMouse, false);
#endif

        if (QLayout *layout=widget->d_func()->layout) {
            layout->widgetEvent(e);
        }
    }

    // send to all receiver event filters
    if (sendThroughObjectEventFilters(receiver, e)) {
        filtered = true;
        return filtered;
    }

    // deliver the event
    consumed = receiver->event(e);

    QCoreApplicationPrivate::setEventSpontaneous(e, false);
    return consumed;
}